

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::SafeDecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  HuffmanCode *pHVar4;
  ulong uVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  HuffmanCode *pHVar15;
  byte *pbVar16;
  ulong local_40;
  ulong local_38;
  
  uVar3 = s->num_block_types[2];
  if (uVar3 < 2) {
LAB_0036ac85:
    iVar7 = 0;
  }
  else {
    pHVar15 = s->block_type_trees;
    pHVar4 = s->block_len_trees;
    br = &s->br;
    uVar11 = (s->br).val_;
    uVar5 = (s->br).bit_pos_;
    pbVar6 = (s->br).next_in;
    pbVar9 = (s->br).last_in;
    lVar14 = (long)pbVar9 - (long)pbVar6;
    uVar8 = uVar5;
    uVar12 = uVar11;
    pbVar16 = pbVar6;
    while (uVar8 < 0xf) {
      if (pbVar16 == pbVar9) {
        iVar7 = SafeDecodeSymbol(pHVar15 + 0x4f0,br,&local_40);
        if (iVar7 == 0) goto LAB_0036ac85;
        goto LAB_0036aaf8;
      }
      uVar12 = uVar12 | (ulong)*pbVar16 << ((byte)uVar8 & 0x3f);
      (s->br).val_ = uVar12;
      uVar8 = uVar8 + 8;
      (s->br).bit_pos_ = uVar8;
      pbVar16 = pbVar16 + 1;
      (s->br).next_in = pbVar16;
    }
    pHVar15 = pHVar15 + 0x4f0 + (uVar12 & 0xff);
    uVar10 = (ulong)pHVar15->bits;
    uVar13 = uVar12;
    if (8 < uVar10) {
      uVar8 = uVar8 - 8;
      uVar13 = uVar12 >> 8;
      pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                  (uint)(uVar12 >> 8) & 0x7f) + (ulong)pHVar15->value;
      uVar10 = (ulong)pHVar15->bits;
    }
    (s->br).bit_pos_ = uVar8 - uVar10;
    (s->br).val_ = uVar13 >> ((byte)uVar10 & 0x3f);
    local_40 = (ulong)pHVar15->value;
LAB_0036aaf8:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar8 = (s->br).bit_pos_;
      while (uVar8 < 0xf) {
        pbVar9 = (s->br).next_in;
        if (pbVar9 == (s->br).last_in) {
          iVar7 = SafeDecodeSymbol(pHVar4 + 0x318,br,&local_38);
          if (iVar7 != 0) goto LAB_0036abb4;
          goto LAB_0036ac49;
        }
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar9 << ((byte)uVar8 & 0x3f);
        uVar8 = uVar8 + 8;
        (s->br).bit_pos_ = uVar8;
        (s->br).next_in = pbVar9 + 1;
      }
      uVar12 = br->val_;
      pHVar15 = pHVar4 + 0x318 + (uVar12 & 0xff);
      uVar10 = (ulong)pHVar15->bits;
      uVar13 = uVar12;
      if (8 < uVar10) {
        uVar8 = uVar8 - 8;
        uVar13 = uVar12 >> 8;
        pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                    (uint)(uVar12 >> 8) & 0x7f) + (ulong)pHVar15->value;
        uVar10 = (ulong)pHVar15->bits;
      }
      (s->br).bit_pos_ = uVar8 - uVar10;
      (s->br).val_ = uVar13 >> ((byte)uVar10 & 0x3f);
      local_38 = (ulong)pHVar15->value;
    }
    else {
      local_38 = s->block_length_index;
    }
LAB_0036abb4:
    bVar1 = (&DAT_00452612)[local_38 * 4];
    uVar12 = (ulong)bVar1;
    uVar2 = (&_kBrotliPrefixCodeRanges)[local_38 * 2];
    uVar8 = (s->br).bit_pos_;
    while (uVar8 < uVar12) {
      pbVar9 = (s->br).next_in;
      if (pbVar9 == (s->br).last_in) {
        s->block_length_index = local_38;
LAB_0036ac49:
        s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
        (s->br).val_ = uVar11;
        (s->br).bit_pos_ = uVar5;
        (s->br).next_in = pbVar6;
        (s->br).last_in = pbVar6 + lVar14;
        pbVar9 = pbVar6 + lVar14 + -0x1b;
        if (0xffffffffffffffe2 < lVar14 - 0x1cU) {
          pbVar9 = pbVar6;
        }
        (s->br).guard_in = pbVar9;
        goto LAB_0036ac85;
      }
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar9 << ((byte)uVar8 & 0x3f);
      uVar8 = uVar8 + 8;
      (s->br).bit_pos_ = uVar8;
      (s->br).next_in = pbVar9 + 1;
    }
    uVar11 = (s->br).val_;
    uVar5 = *(ulong *)(kBrotliBitMask + uVar12 * 8);
    (s->br).bit_pos_ = uVar8 - uVar12;
    (s->br).val_ = uVar11 >> (bVar1 & 0x3f);
    s->block_length[2] = (uVar5 & uVar11) + (ulong)uVar2;
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_40 == 0) {
      local_40 = s->block_type_rb[4];
    }
    else if (local_40 == 1) {
      local_40 = s->block_type_rb[5] + 1;
    }
    else {
      local_40 = local_40 - 2;
    }
    uVar11 = 0;
    if (uVar3 <= local_40) {
      uVar11 = uVar3;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = local_40 - uVar11;
    s->dist_context_map_slice = s->dist_context_map + (local_40 - uVar11) * 4;
    s->dist_htree_index = (s->dist_context_map + (local_40 - uVar11) * 4)[s->distance_context];
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}